

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t croaring_detect_supported_architectures(void)

{
  if (croaring_detect_supported_architectures::buffer == 0x8000) {
    croaring_detect_supported_architectures::buffer =
         dynamic_croaring_detect_supported_architectures();
    LOCK();
    UNLOCK();
  }
  return croaring_detect_supported_architectures::buffer;
}

Assistant:

static uint32_t croaring_detect_supported_architectures(void) {
    // we use an atomic for thread safety
    static _Atomic uint32_t buffer = CROARING_UNINITIALIZED;
    if (buffer == CROARING_UNINITIALIZED) {
        // atomicity is sufficient
        buffer = dynamic_croaring_detect_supported_architectures();
    }
    return buffer;
}